

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapArea_rec(Ivy_Man_t *pAig,Ivy_Obj_t *pObj,Vec_Vec_t *vLuts)

{
  short sVar1;
  uint *puVar2;
  int iVar3;
  long lVar4;
  void **ppvVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  size_t __size;
  char *pcVar9;
  long lVar10;
  int iVar11;
  
  lVar10 = *(long *)((long)pAig->pData + 0x10);
  lVar4 = (long)*(int *)((long)pAig->pData + 8) * (long)pObj->Id;
  iVar8 = 0;
  if (*(char *)(lVar10 + 1 + lVar4) == '\0') {
    pcVar9 = (char *)(lVar10 + lVar4);
    iVar8 = 0;
    if (*pcVar9 != '\x01') {
      pcVar9[1] = '\x01';
      if (*pcVar9 < '\x01') {
        iVar8 = 1;
      }
      else {
        lVar10 = 0;
        iVar8 = 0;
        do {
          iVar3 = *(int *)(pcVar9 + lVar10 * 4 + 0xc);
          if (((long)iVar3 < 0) || (pAig->vObjs->nSize <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar3 = Ivy_FastMapArea_rec(pAig,(Ivy_Obj_t *)pAig->vObjs->pArray[iVar3],vLuts);
          iVar8 = iVar8 + iVar3;
          lVar10 = lVar10 + 1;
        } while (lVar10 < *pcVar9);
        iVar8 = iVar8 + 1;
      }
      sVar1 = *(short *)(pcVar9 + 8);
      uVar7 = (uint)sVar1;
      iVar3 = vLuts->nSize;
      if (iVar3 <= (int)uVar7) {
        iVar11 = (int)((long)(int)uVar7 + 1);
        if (vLuts->nCap <= (int)uVar7) {
          __size = ((long)(int)uVar7 + 1) * 8;
          if (vLuts->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(__size);
          }
          else {
            ppvVar5 = (void **)realloc(vLuts->pArray,__size);
            iVar3 = vLuts->nSize;
          }
          vLuts->pArray = ppvVar5;
          vLuts->nCap = iVar11;
        }
        if (iVar3 <= (int)uVar7) {
          lVar10 = (long)iVar3;
          iVar3 = (uVar7 - iVar3) + 1;
          do {
            pvVar6 = calloc(1,0x10);
            vLuts->pArray[lVar10] = pvVar6;
            lVar10 = lVar10 + 1;
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        vLuts->nSize = iVar11;
        iVar3 = iVar11;
      }
      if ((sVar1 < 0) || (iVar3 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      puVar2 = (uint *)vLuts->pArray[uVar7];
      uVar7 = puVar2[1];
      if (uVar7 == *puVar2) {
        if ((int)uVar7 < 0x10) {
          if (*(void **)(puVar2 + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar2 + 2),0x80);
          }
          *(void **)(puVar2 + 2) = pvVar6;
          *puVar2 = 0x10;
        }
        else {
          if (*(void **)(puVar2 + 2) == (void *)0x0) {
            pvVar6 = malloc((ulong)uVar7 << 4);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar2 + 2),(ulong)uVar7 << 4);
          }
          *(void **)(puVar2 + 2) = pvVar6;
          *puVar2 = uVar7 * 2;
        }
      }
      else {
        pvVar6 = *(void **)(puVar2 + 2);
      }
      uVar7 = puVar2[1];
      puVar2[1] = uVar7 + 1;
      *(Ivy_Obj_t **)((long)pvVar6 + (long)(int)uVar7 * 8) = pObj;
    }
  }
  return iVar8;
}

Assistant:

int Ivy_FastMapArea_rec( Ivy_Man_t * pAig, Ivy_Obj_t * pObj, Vec_Vec_t * vLuts )
{
    Ivy_Supp_t * pSupp;
    int i, Counter;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    // skip visited nodes and PIs
    if ( pSupp->fMark || pSupp->nSize == 1 )
        return 0;
    pSupp->fMark = 1;
    // compute the area of this node
    Counter = 0;
    for ( i = 0; i < pSupp->nSize; i++ )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ManObj(pAig, pSupp->pArray[i]), vLuts );
    // add the node to the array of LUTs
    Vec_VecPush( vLuts, pSupp->Delay, pObj );
    return 1 + Counter;
}